

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
pbrt::ThinDielectricMaterial::ThinDielectricMaterial
          (ThinDielectricMaterial *this,FloatTextureHandle *etaF,SpectrumTextureHandle *etaS,
          FloatTextureHandle *displacement)

{
  bool bVar1;
  bool bVar2;
  FloatTextureHandle *in_RCX;
  TaggedPointer *in_RDX;
  TaggedPointer *in_RSI;
  FloatTextureHandle *in_RDI;
  char (*unaff_retaddr) [24];
  char *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  LogLevel in_stack_00000024;
  
  FloatTextureHandle::FloatTextureHandle(in_RDI,in_RCX);
  FloatTextureHandle::FloatTextureHandle(in_RDI,in_RCX);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_RDI,(SpectrumTextureHandle *)in_RCX);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(in_RSI);
  bVar2 = pbrt::TaggedPointer::operator_cast_to_bool(in_RDX);
  if (bVar1 == bVar2) {
    LogFatal<char_const(&)[24]>
              (in_stack_00000024,in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr
              );
  }
  return;
}

Assistant:

ThinDielectricMaterial(FloatTextureHandle etaF, SpectrumTextureHandle etaS,
                           FloatTextureHandle displacement)
        : displacement(displacement), etaF(etaF), etaS(etaS) {
        CHECK((bool)etaF ^ (bool)etaS);
    }